

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O0

int __thiscall Buffer::copy(Buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uchar *__dest;
  uchar *__src;
  pointer pMVar1;
  Buffer *this_local;
  Buffer *result;
  
  pMVar1 = std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator->
                     ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> *)dst);
  Buffer(this,pMVar1->size);
  pMVar1 = std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator->
                     ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> *)dst);
  if (pMVar1->size != 0) {
    pMVar1 = std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator->
                       (&this->m);
    __dest = pMVar1->buf;
    pMVar1 = std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator->
                       ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> *)dst);
    __src = pMVar1->buf;
    pMVar1 = std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator->
                       ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> *)dst);
    memcpy(__dest,__src,pMVar1->size);
  }
  return (int)this;
}

Assistant:

Buffer
Buffer::copy() const
{
    auto result = Buffer(m->size);
    if (m->size) {
        memcpy(result.m->buf, m->buf, m->size);
    }
    return result;
}